

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O1

void __thiscall
tyti::stl::
stl_parser_ascii<float,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~stl_parser_ascii(stl_parser_ascii<float,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  boost::
  function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::fusion::nil_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function4(&(this->endSolid).f.
                super_function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::fusion::nil_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
              );
  pcVar1 = (this->endSolid).name_._M_dataplus._M_p;
  paVar2 = &(this->endSolid).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  boost::
  function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<tyti::stl::basic_vec3<float>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function4(&(this->vector).f.
                super_function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<tyti::stl::basic_vec3<float>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
              );
  pcVar1 = (this->vector).name_._M_dataplus._M_p;
  paVar2 = &(this->vector).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  boost::
  function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function4(&(this->startSolid).f.
                super_function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
              );
  pcVar1 = (this->startSolid).name_._M_dataplus._M_p;
  paVar2 = &(this->startSolid).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  boost::
  function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<tyti::stl::basic_solid<float>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  ::~function4(&(this->start).f.
                super_function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<tyti::stl::basic_solid<float>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
              );
  pcVar1 = (this->start).name_._M_dataplus._M_p;
  paVar2 = &(this->start).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->
           super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
           ).name_._M_dataplus._M_p;
  paVar2 = &(this->
            super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
            ).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

stl_parser_ascii() : stl_parser_ascii::base_type(start)
            {
                namespace qi = boost::spirit::qi;
                namespace ql = qi::labels;
                namespace ascii = boost::spirit::ascii;
                namespace fusion = boost::fusion;
                namespace px = boost::phoenix;

                startSolid %= qi::lexeme[qi::lit("solid ") >> (+(ascii::char_ - qi::eol) | qi::attr(""))]; //either return header or empty string if no header was found 

                endSolid = qi::lexeme[qi::lit("endsolid ") >> ascii::string(ql::_r1)];

                vector %= qi::float_ >> qi::float_ >> qi::float_;

                start =
                    startSolid[px::at_c<0>(ql::_val) = ql::_1]

                    >> *(qi::lit("facet") >> qi::lit("normal") >> vector[px::push_back(px::at_c<1>(ql::_val), ql::_1)]//normal
                        //vertices
                        >> qi::lit("outer loop")
                        >> qi::repeat(3)[qi::lit("vertex") >> vector[px::push_back(px::at_c<2>(ql::_val), ql::_1)]]
                        >> qi::lit("endloop")
                        >> qi::lit("endfacet")
                        )
                    //end
                    >> endSolid(px::at_c<0>(ql::_val))
                    ;
            }